

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::convertToLowerCase_abi_cxx11_(string_view input)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  string *in_RDI;
  string *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string *this;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(&local_1a);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (in_stack_ffffffffffffff88);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this)
  ;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (in_stack_ffffffffffffff88);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,gmlc::utilities::__0>
            (iVar1._M_current,iVar2._M_current,iVar3._M_current);
  return in_RDI;
}

Assistant:

std::string convertToLowerCase(std::string_view input)
{
    std::string out(input);
    std::transform(out.begin(), out.end(), out.begin(), lower);
    return out;
}